

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeotetrahedra.h
# Opt level: O1

void pzgeom::TPZGeoTetrahedra::X<double>
               (TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *x)

{
  double dVar1;
  uint uVar2;
  int j;
  long lVar3;
  ulong uVar4;
  double extraout_XMM0_Qa;
  TPZFNMatrix<4,_double> phi;
  TPZFNMatrix<12,_double> dphi;
  TPZFMatrix<double> local_1e0;
  double local_150 [5];
  TPZFMatrix<double> local_128;
  double adStack_98 [13];
  
  local_1e0.fElem = local_150;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 4;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018a08f0;
  local_1e0.fSize = 4;
  local_1e0.fGiven = local_1e0.fElem;
  TPZVec<int>::TPZVec(&local_1e0.fPivot.super_TPZVec<int>,0);
  local_1e0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_1e0.fPivot.super_TPZVec<int>.fStore = local_1e0.fPivot.fExtAlloc;
  local_1e0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_1e0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_1e0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_1e0.fWork.fStore = (double *)0x0;
  local_1e0.fWork.fNElements = 0;
  local_1e0.fWork.fNAlloc = 0;
  local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018a0600;
  local_128.fElem = adStack_98;
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 4;
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018aee30;
  local_128.fSize = 0xc;
  local_128.fGiven = local_128.fElem;
  TPZVec<int>::TPZVec(&local_128.fPivot.super_TPZVec<int>,0);
  local_128.fPivot.super_TPZVec<int>.fStore = local_128.fPivot.fExtAlloc;
  local_128.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_128.fPivot.super_TPZVec<int>.fNElements = 0;
  local_128.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_128.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  local_128.fWork.fStore = (double *)0x0;
  local_128.fWork.fNElements = 0;
  local_128.fWork.fNAlloc = 0;
  local_128.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_018aeb40;
  pztopology::TPZTetrahedron::TShape<double>(loc,&local_1e0,&local_128);
  uVar2 = (uint)(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if (0 < (int)uVar2) {
    uVar4 = 0;
    do {
      x->fStore[uVar4] = 0.0;
      lVar3 = 0;
      do {
        if ((local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar3) ||
           (local_1e0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar1 = local_1e0.fElem[lVar3];
        (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(nodes,uVar4,lVar3);
        x->fStore[uVar4] = dVar1 * extraout_XMM0_Qa + x->fStore[uVar4];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uVar2 & 0x7fffffff));
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_128,&PTR_PTR_018aedf8);
  TPZFMatrix<double>::~TPZFMatrix(&local_1e0,&PTR_PTR_018a08b8);
  return;
}

Assistant:

inline void TPZGeoTetrahedra::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        TPZFNMatrix<4,T> phi(NNodes,1);
        TPZFNMatrix<12,T> dphi(3,NNodes);
        TShape(loc,phi,dphi);
        int space = nodes.Rows();
        
        for(int i = 0; i < space; i++) {
            x[i] = 0.0;
            for(int j = 0; j < NNodes; j++) {
                x[i] += phi(j,0)*nodes.GetVal(i,j);
            }
        }
    }